

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  ushort uVar1;
  ImFont *pIVar2;
  float *pfVar3;
  
  if ((obj->TextW).Size <= line_start_idx + char_idx) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x52e,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
  }
  uVar1 = (obj->TextW).Data[line_start_idx + char_idx];
  if (uVar1 == 10) {
    return -1.0;
  }
  pIVar2 = GImGui->Font;
  pfVar3 = &pIVar2->FallbackAdvanceX;
  if ((int)(uint)uVar1 < (pIVar2->IndexAdvanceX).Size) {
    pfVar3 = (float *)((ulong)((uint)uVar1 * 4) + (long)(pIVar2->IndexAdvanceX).Data);
  }
  return (GImGui->FontSize / pIVar2->FontSize) * *pfVar3;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->TextW[line_start_idx + char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; ImGuiContext& g = *GImGui; return g.Font->GetCharAdvance(c) * (g.FontSize / g.Font->FontSize); }